

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void game_loop_unix(int control)

{
  PC_DATA *pPVar1;
  string_view fmt;
  string_view fmt_00;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  int in_EDI;
  timeval stall_time;
  long usecDelta;
  long secDelta;
  timeval now_time;
  int i;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxdesc;
  DESCRIPTOR_DATA *d;
  fd_set exc_set;
  fd_set out_set;
  fd_set in_set;
  timeval last_time;
  DESCRIPTOR_DATA *in_stack_00001030;
  int in_stack_00001064;
  DESCRIPTOR_DATA *in_stack_00001068;
  char *in_stack_000021b8;
  DESCRIPTOR_DATA *in_stack_000021c0;
  char *in_stack_00004080;
  DESCRIPTOR_DATA *in_stack_00004088;
  char *in_stack_000045c8;
  CHAR_DATA *in_stack_000045d0;
  CHAR_DATA *in_stack_00004628;
  char *in_stack_000057d8;
  descriptor_data *in_stack_000057e0;
  char *in_stack_00006a10;
  CHAR_DATA *in_stack_00006a18;
  char *in_stack_00006b00;
  CHAR_DATA *in_stack_00006b08;
  DESCRIPTOR_DATA *in_stack_fffffffffffffd98;
  DESCRIPTOR_DATA *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdb0;
  char **in_stack_fffffffffffffdd0;
  DESCRIPTOR_DATA *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  DESCRIPTOR_DATA *local_210;
  timeval local_208;
  int local_1f4;
  char *local_1f0;
  int local_1d4;
  fd_set *local_1d0;
  uint local_1c4;
  fd_set *local_1c0;
  uint local_1b4;
  fd_set *local_1b0;
  uint local_1a8;
  int local_1a4;
  DESCRIPTOR_DATA *local_1a0;
  fd_set local_198;
  fd_set local_118;
  fd_set local_98;
  timeval local_18;
  int local_4;
  
  local_4 = in_EDI;
  signal(0xd,(__sighandler_t)0x1);
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  do {
    current_time = local_18.tv_sec;
    if (((merc_down ^ 0xffU) & 1) == 0) {
      return;
    }
    local_1b0 = &local_98;
    for (local_1a8 = 0; local_1a8 < 0x10; local_1a8 = local_1a8 + 1) {
      local_1b0->fds_bits[local_1a8] = 0;
    }
    local_1c0 = &local_118;
    for (local_1b4 = 0; local_1b4 < 0x10; local_1b4 = local_1b4 + 1) {
      local_1c0->fds_bits[local_1b4] = 0;
    }
    local_1d0 = &local_198;
    for (local_1c4 = 0; local_1c4 < 0x10; local_1c4 = local_1c4 + 1) {
      local_1d0->fds_bits[local_1c4] = 0;
    }
    local_98.fds_bits[local_4 / 0x40] =
         1L << ((byte)((long)local_4 % 0x40) & 0x3f) | local_98.fds_bits[local_4 / 0x40];
    local_1a4 = local_4;
    for (local_1a0 = descriptor_list; local_1a0 != (DESCRIPTOR_DATA *)0x0;
        local_1a0 = local_1a0->next) {
      local_1d4 = (int)local_1a0->descriptor;
      piVar4 = std::max<int>(&local_1a4,&local_1d4);
      local_1a4 = *piVar4;
      iVar3 = (int)local_1a0->descriptor / 0x40;
      local_98.fds_bits[iVar3] =
           1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) | local_98.fds_bits[iVar3]
      ;
      iVar3 = (int)local_1a0->descriptor / 0x40;
      local_118.fds_bits[iVar3] =
           1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) |
           local_118.fds_bits[iVar3];
      iVar3 = (int)local_1a0->descriptor / 0x40;
      local_198.fds_bits[iVar3] =
           1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) |
           local_198.fds_bits[iVar3];
    }
    iVar3 = select(local_1a4 + 1,&local_98,&local_118,&local_198,
                   (timeval *)&game_loop_unix::null_time);
    if (iVar3 < 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      piVar4 = __errno_location();
      local_1f0 = strerror(*piVar4);
      fmt._M_str = in_stack_fffffffffffffde8;
      fmt._M_len = (size_t)in_stack_fffffffffffffde0;
      CLogger::Error<char*>((CLogger *)in_stack_fffffffffffffdd8,fmt,in_stack_fffffffffffffdd0);
      exit(0);
    }
    if ((local_98.fds_bits[local_4 / 0x40] & 1L << ((byte)((long)local_4 % 0x40) & 0x3f)) != 0) {
      init_descriptor(in_stack_00001064);
    }
    local_1a0 = descriptor_list;
    while (local_1a0 != (DESCRIPTOR_DATA *)0x0) {
      d_next = local_1a0->next;
      in_stack_fffffffffffffdb0 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           local_198.fds_bits[(int)local_1a0->descriptor / 0x40];
      if (((ulong)in_stack_fffffffffffffdb0 &
          1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f)) != 0) {
        iVar3 = (int)local_1a0->descriptor / 0x40;
        local_98.fds_bits[iVar3] =
             (1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) ^ 0xffffffffffffffffU)
             & local_98.fds_bits[iVar3];
        iVar3 = (int)local_1a0->descriptor / 0x40;
        local_118.fds_bits[iVar3] =
             (1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) ^ 0xffffffffffffffffU)
             & local_118.fds_bits[iVar3];
        if ((local_1a0->character != (CHAR_DATA *)0x0) && (1 < local_1a0->character->level)) {
          save_char_obj(in_stack_00004628);
        }
        local_1a0->outtop = 0;
        close_socket(in_stack_00001030);
      }
      local_1a0 = d_next;
    }
    local_1a0 = descriptor_list;
    while (local_1a0 != (DESCRIPTOR_DATA *)0x0) {
      d_next = local_1a0->next;
      local_1a0->fcommand = false;
      in_stack_fffffffffffffda8 = (char *)local_98.fds_bits[(int)local_1a0->descriptor / 0x40];
      if (((ulong)in_stack_fffffffffffffda8 &
          1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f)) == 0) {
LAB_005a5895:
        if ((local_1a0->character != (CHAR_DATA *)0x0) && (0 < local_1a0->character->wait)) {
          local_1a0->character->wait = local_1a0->character->wait + -1;
        }
        if (((local_1a0->character == (CHAR_DATA *)0x0) || (0 < local_1a0->character->wait)) ||
           ((local_1a0->character->pcdata->pending & 1U) == 0)) {
          read_from_buffer(in_stack_fffffffffffffda0);
          if (local_1a0->incomm[0] != '\0') {
            local_1a0->fcommand = true;
            stop_idling((CHAR_DATA *)in_stack_fffffffffffffda0);
            if (local_1a0->showstr_point == (char *)0x0) {
              if (local_1a0->pString == (char **)0x0) {
                if (((local_1a0->connected == 0) && (local_1a0->character->pcdata != (PC_DATA *)0x0)
                    ) && ((local_1a0->character->pcdata->entering_text & 1U) != 0)) {
                  process_text(in_stack_000045d0,in_stack_000045c8);
                }
                else if (local_1a0->connected == 0) {
                  bVar2 = run_olc_editor(in_stack_fffffffffffffd98);
                  if (!bVar2) {
                    substitute_alias(in_stack_000021c0,in_stack_000021b8);
                  }
                }
                else {
                  nanny(in_stack_00004088,in_stack_00004080);
                }
              }
              else {
                string_add(in_stack_00006a18,in_stack_00006a10);
              }
            }
            else {
              show_string(in_stack_000057e0,in_stack_000057d8);
            }
            local_1a0->incomm[0] = '\0';
          }
        }
        else {
          local_1f4 = 0;
          interpret(in_stack_00006b08,in_stack_00006b00);
          if (local_1a0->character != (CHAR_DATA *)0x0) {
            for (local_1f4 = 1; local_1f4 < local_1a0->character->pcdata->write_next;
                local_1f4 = local_1f4 + 1) {
              strcpy(local_1a0->character->pcdata->queue[local_1f4 + -1],
                     local_1a0->character->pcdata->queue[local_1f4]);
            }
            pPVar1 = local_1a0->character->pcdata;
            pPVar1->write_next = pPVar1->write_next + -1;
            for (local_1f4 = (int)local_1a0->character->pcdata->write_next; local_1f4 < 0x14;
                local_1f4 = local_1f4 + 1) {
              local_1a0->character->pcdata->queue[local_1f4][0] = '\0';
            }
            if (local_1a0->character->pcdata->write_next == 0) {
              local_1a0->character->pcdata->pending = false;
            }
          }
        }
      }
      else {
        if (local_1a0->character != (CHAR_DATA *)0x0) {
          local_1a0->character->timer = 0;
        }
        bVar2 = read_from_descriptor(in_stack_fffffffffffffdd8);
        if (bVar2) goto LAB_005a5895;
        iVar3 = (int)local_1a0->descriptor / 0x40;
        local_118.fds_bits[iVar3] =
             (1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f) ^ 0xffffffffffffffffU)
             & local_118.fds_bits[iVar3];
        if ((local_1a0->character != (CHAR_DATA *)0x0) && (1 < local_1a0->character->level)) {
          save_char_obj(in_stack_00004628);
        }
        local_1a0->outtop = 0;
        close_socket(in_stack_00001030);
      }
      local_1a0 = d_next;
    }
    update_handler();
    local_1a0 = descriptor_list;
    while (local_1a0 != (DESCRIPTOR_DATA *)0x0) {
      d_next = local_1a0->next;
      if (((((local_1a0->fcommand & 1U) != 0) || (0 < local_1a0->outtop)) &&
          (in_stack_fffffffffffffda0 =
                (DESCRIPTOR_DATA *)local_118.fds_bits[(int)local_1a0->descriptor / 0x40],
          ((ulong)in_stack_fffffffffffffda0 &
          1L << ((byte)((long)(int)local_1a0->descriptor % 0x40) & 0x3f)) != 0)) &&
         (bVar2 = process_output(in_stack_00001068,SUB41((uint)in_stack_00001064 >> 0x18,0)), !bVar2
         )) {
        if ((local_1a0->character != (CHAR_DATA *)0x0) && (1 < local_1a0->character->level)) {
          save_char_obj(in_stack_00004628);
        }
        local_1a0->outtop = 0;
        close_socket(in_stack_00001030);
      }
      local_1a0 = d_next;
    }
    gettimeofday(&local_208,(__timezone_ptr_t)0x0);
    local_210 = (DESCRIPTOR_DATA *)(long)((int)local_18.tv_sec - (int)local_208.tv_sec);
    for (pcVar5 = (char *)(long)(((int)local_18.tv_usec - (int)local_208.tv_usec) + 250000);
        (long)pcVar5 < 0; pcVar5 = pcVar5 + 1000000) {
      local_210 = (DESCRIPTOR_DATA *)&local_210[-1].field_0x6c77;
    }
    for (; 999999 < (long)pcVar5; pcVar5 = pcVar5 + -1000000) {
      local_210 = (DESCRIPTOR_DATA *)((long)&local_210->next + 1);
    }
    in_stack_fffffffffffffde8 = pcVar5;
    if (((0 < (long)local_210) || ((local_210 == (DESCRIPTOR_DATA *)0x0 && (0 < (long)pcVar5)))) &&
       (iVar3 = select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,
                       (timeval *)&stack0xfffffffffffffdd8), in_stack_fffffffffffffdd8 = local_210,
       in_stack_fffffffffffffde0 = pcVar5, iVar3 < 0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      piVar4 = __errno_location();
      strerror(*piVar4);
      fmt_00._M_str = in_stack_fffffffffffffde8;
      fmt_00._M_len = (size_t)pcVar5;
      CLogger::Error<char*>((CLogger *)local_210,fmt_00,in_stack_fffffffffffffdd0);
      exit(1);
    }
    gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  } while( true );
}

Assistant:

void game_loop_unix(int control)
{
	static struct timeval null_time;
	struct timeval last_time;

	signal(SIGPIPE, SIG_IGN);
	gettimeofday(&last_time, nullptr);
	current_time = (time_t)last_time.tv_sec;

	/* Main loop */
	while (!merc_down)
	{
		fd_set in_set;
		fd_set out_set;
		fd_set exc_set;
		DESCRIPTOR_DATA *d;
		int maxdesc;

#ifdef MALLOC_DEBUG
		if (malloc_verify() != 1)
			abort();
#endif

		/*
		 * Poll all active descriptors.
		 */
		FD_ZERO(&in_set);
		FD_ZERO(&out_set);
		FD_ZERO(&exc_set);
		FD_SET(control, &in_set);

		maxdesc = control;

		for (d = descriptor_list; d; d = d->next)
		{
			maxdesc = std::max(maxdesc, (int)d->descriptor);
			FD_SET(d->descriptor, &in_set);
			FD_SET(d->descriptor, &out_set);
			FD_SET(d->descriptor, &exc_set);
		}

		if (select(maxdesc + 1, &in_set, &out_set, &exc_set, &null_time) < 0)
		{
			RS.Logger.Error("Game_loop: select poll: {}", std::strerror(errno));
			exit(0);
		}

		/*
		 * New connection?
		 */
		if (FD_ISSET(control, &in_set))
			init_descriptor(control);

		/*
		 * Kick out the freaky folks.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if (FD_ISSET(d->descriptor, &exc_set))
			{
				FD_CLR(d->descriptor, &in_set);
				FD_CLR(d->descriptor, &out_set);

				if (d->character && d->character->level > 1)
					save_char_obj(d->character);

				d->outtop = 0;
				close_socket(d);
			}
		}

		/*
		 * Process input.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;
			d->fcommand= false;

			if (FD_ISSET(d->descriptor, &in_set))
			{
				if (d->character != nullptr)
					d->character->timer = 0;

				if (!read_from_descriptor(d))
				{
					FD_CLR(d->descriptor, &out_set);

					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
					continue;
				}
			}

			if (d->character != nullptr && d->character->wait > 0)
				--d->character->wait;

			if (d->character != nullptr && d->character->wait <= 0 && d->character->pcdata->pending)
			{
				int i = 0;
				interpret(d->character, d->character->pcdata->queue[0]);

				if (!d->character) // Cal: Silly Morglum.  But what if we just interpreted a "quit"?
					continue;	   // then d->character is null and we just crashed. :(

				for (i = 1; i < d->character->pcdata->write_next; i++)
				{
					strcpy(d->character->pcdata->queue[(i - 1)], d->character->pcdata->queue[i]);
				}

				d->character->pcdata->write_next--;

				for (i = d->character->pcdata->write_next; i < MAX_QUEUE; i++)
				{
					d->character->pcdata->queue[i][0] = '\0';
				}

				if (d->character->pcdata->write_next == 0)
					d->character->pcdata->pending= false;

				continue;
				/*
					d->character->pcdata->queue[d->character->pcdata->read_next][0] = '\0';
					d->character->pcdata->read_next++;

					if (d->character->pcdata->read_next > 19)
						d->character->pcdata->read_next = 0;
					if (d->character->pcdata->queue[d->character->pcdata->read_next][0] == '\0')
						d->character->pcdata->pending= false;
				*/
			}

			read_from_buffer(d);
			if (d->incomm[0] != '\0')
			{
				d->fcommand = true;
				stop_idling(d->character);

				/* OLC */
				if (d->showstr_point)
				{
					show_string(d, d->incomm);
				}
				else if (d->pString)
				{
					string_add(d->character, d->incomm);
				}
				else if (d->connected == CON_PLAYING && d->character->pcdata && d->character->pcdata->entering_text)
				{
					process_text(d->character, d->incomm);
				}
				else
				{
					switch (d->connected)
					{
						case CON_PLAYING:
							if (!run_olc_editor(d))
								substitute_alias(d, d->incomm);
							break;
						default:
							nanny(d, d->incomm);
							break;
					}
				}
				/*		if (d->showstr_point)
							show_string(d,d->incomm);
						else if ( d->connected == CON_PLAYING && d->character->pcdata &&
				   d->character->pcdata->entering_text ) process_text(d->character, d->incomm); else if ( d->connected
				   == CON_PLAYING ) substitute_alias( d, d->incomm ); else nanny( d, d->incomm );
				*/
				d->incomm[0] = '\0';
			}
		}

		/*
		 * Autonomous game motion.
		 */
		update_handler();

		/*
		 * Output.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if ((d->fcommand || d->outtop > 0) && FD_ISSET(d->descriptor, &out_set))
			{
				if (!process_output(d, true))
				{
					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
				}
			}
		}

		/*
		 * Synchronize to a clock.
		 * Sleep( last_time + 1/PULSE_PER_SECOND - now ).
		 * Careful here of signed versus unsigned arithmetic.
		 */
		{
			struct timeval now_time;
			long secDelta;
			long usecDelta;

			gettimeofday(&now_time, nullptr);

			usecDelta = ((int)last_time.tv_usec) - ((int)now_time.tv_usec) + 1000000 / PULSE_PER_SECOND;
			secDelta = ((int)last_time.tv_sec) - ((int)now_time.tv_sec);

			while (usecDelta < 0)
			{
				usecDelta += 1000000;
				secDelta -= 1;
			}

			while (usecDelta >= 1000000)
			{
				usecDelta -= 1000000;
				secDelta += 1;
			}

			if (secDelta > 0 || (secDelta == 0 && usecDelta > 0))
			{
				struct timeval stall_time;

				stall_time.tv_usec = usecDelta;
				stall_time.tv_sec = secDelta;

				if (select(0, nullptr, nullptr, nullptr, &stall_time) < 0)
				{
					RS.Logger.Error("Game_loop: select stall: {}", std::strerror(errno));
					exit(1);
				}
			}
		}

		gettimeofday(&last_time, nullptr);
		current_time = (time_t)last_time.tv_sec;
	}
}